

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O2

bool deqp::egl::anon_unknown_0::compareToReference
               (TestLog *log,Surface *reference,Surface *buffer,int frameNdx,int bufferNum)

{
  bool bVar1;
  ostream *poVar2;
  char *local_238 [4];
  IVec3 local_214;
  UVec4 local_208;
  ConstPixelBufferAccess local_1f8;
  ConstPixelBufferAccess local_1d0;
  ostringstream stream;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  poVar2 = std::operator<<((ostream *)&stream,"FrameNdx = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,frameNdx);
  poVar2 = std::operator<<(poVar2,", compare current buffer (numbered: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bufferNum);
  std::operator<<(poVar2,") to reference");
  std::__cxx11::stringbuf::str();
  tcu::Surface::getAccess(&local_1d0,reference);
  tcu::Surface::getAccess(&local_1f8,buffer);
  local_208.m_data[0] = 8;
  local_208.m_data[1] = 8;
  local_208.m_data[2] = 8;
  local_208.m_data[3] = 0;
  local_214.m_data[0] = 2;
  local_214.m_data[1] = 2;
  local_214.m_data[2] = 0;
  bVar1 = tcu::intThresholdPositionDeviationCompare
                    (log,"partial update test",local_238[0],&local_1d0,&local_1f8,&local_208,
                     &local_214,true,COMPARE_LOG_RESULT);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  return bVar1;
}

Assistant:

bool compareToReference (tcu::TestLog& log,	 const tcu::Surface& reference, const tcu::Surface& buffer, int frameNdx, int bufferNum)
{
	std::ostringstream stream;
	stream << "FrameNdx = " << frameNdx << ", compare current buffer (numbered: " << bufferNum << ") to reference";
	return tcu::intThresholdPositionDeviationCompare(log, "partial update test", stream.str().c_str(), reference.getAccess(), buffer.getAccess(),
													 tcu::UVec4(8, 8, 8, 0), tcu::IVec3(2,2,0), true, tcu::COMPARE_LOG_RESULT);
}